

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
::clear(raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
        *this)

{
  size_t sVar1;
  size_t sVar2;
  
  if (this->size_ != 0) {
    if (this->capacity_ < 0x80) {
      if (this->capacity_ != 0) {
        sVar1 = this->capacity_;
        if (sVar1 != 0) {
          sVar2 = 0;
          do {
            if (-1 < this->ctrl_[sVar2]) {
              NodeHashMapPolicy<unsigned_long,VarState>::
              delete_element<std::allocator<std::pair<unsigned_long_const,VarState>>>
                        ((allocator<std::pair<const_unsigned_long,_VarState>_> *)&this->settings_,
                         this->slots_[sVar2]);
            }
            sVar2 = sVar2 + 1;
            sVar1 = this->capacity_;
          } while (sVar2 != sVar1);
        }
        this->size_ = 0;
        memset(this->ctrl_,0x80,sVar1 + 0x10);
        this->ctrl_[this->capacity_] = -1;
        reset_growth_left(this);
      }
    }
    else {
      destroy_slots(this);
    }
    if (this->size_ != 0) {
      __assert_fail("empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x4c3,
                    "void phmap::container_internal::raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned long, VarState>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<std::pair<const unsigned long, VarState>>>::clear() [Policy = phmap::container_internal::NodeHashMapPolicy<unsigned long, VarState>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, VarState>>]"
                   );
    }
  }
  return;
}

Assistant:

bool empty() const { return !size(); }